

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl.h
# Opt level: O2

void __thiscall
flatbuffers::SymbolTable<flatbuffers::Value>::~SymbolTable(SymbolTable<flatbuffers::Value> *this)

{
  Value *pVVar1;
  pointer ppVVar2;
  
  for (ppVVar2 = (this->vec).
                 super__Vector_base<flatbuffers::Value_*,_std::allocator<flatbuffers::Value_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      ppVVar2 !=
      (this->vec).super__Vector_base<flatbuffers::Value_*,_std::allocator<flatbuffers::Value_*>_>.
      _M_impl.super__Vector_impl_data._M_finish; ppVVar2 = ppVVar2 + 1) {
    pVVar1 = *ppVVar2;
    if (pVVar1 != (Value *)0x0) {
      std::__cxx11::string::~string((string *)&pVVar1->constant);
    }
    operator_delete(pVVar1,0x48);
  }
  std::_Vector_base<flatbuffers::Value_*,_std::allocator<flatbuffers::Value_*>_>::~_Vector_base
            (&(this->vec).
              super__Vector_base<flatbuffers::Value_*,_std::allocator<flatbuffers::Value_*>_>);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
               *)this);
  return;
}

Assistant:

~SymbolTable() {
    for (auto it = vec.begin(); it != vec.end(); ++it) { delete *it; }
  }